

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.cpp
# Opt level: O0

void __thiscall
CoreML::TreeEnsembleRegressor::TreeEnsembleRegressor
          (TreeEnsembleRegressor *this,string *predictedValueOutput,string *description)

{
  element_type *peVar1;
  TreeEnsembleRegressor *pTVar2;
  ModelDescription *this_00;
  Model local_38;
  string *local_20;
  string *description_local;
  string *predictedValueOutput_local;
  TreeEnsembleRegressor *this_local;
  
  local_20 = description;
  description_local = predictedValueOutput;
  predictedValueOutput_local = (string *)this;
  Model::Model(&local_38,description);
  TreeEnsembleBase::TreeEnsembleBase(&this->super_TreeEnsembleBase,&local_38,false);
  Model::~Model(&local_38);
  (this->super_TreeEnsembleBase).super_Model._vptr_Model =
       (_func_int **)&PTR__TreeEnsembleRegressor_00576368;
  peVar1 = std::
           __shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_TreeEnsembleBase).super_Model.m_spec);
  pTVar2 = Specification::Model::mutable_treeensembleregressor(peVar1);
  this->tree_regressor_parameters = pTVar2;
  peVar1 = std::
           __shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_TreeEnsembleBase).super_Model.m_spec);
  this_00 = Specification::Model::mutable_description(peVar1);
  Specification::ModelDescription::set_predictedfeaturename(this_00,description_local);
  return;
}

Assistant:

TreeEnsembleRegressor::TreeEnsembleRegressor
    (const std::string& predictedValueOutput,
     const std::string& description)
    : TreeEnsembleBase(Model(description), false /* isClassifier */)
    , tree_regressor_parameters(m_spec->mutable_treeensembleregressor())
    {
        m_spec->mutable_description()->set_predictedfeaturename(predictedValueOutput);
    }